

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_add_itext_sized
               (LodePNGInfo *info,char *key,char *langtag,char *transkey,char *str,size_t size)

{
  size_t sVar1;
  uint uVar2;
  char **ppcVar3;
  char **ppcVar4;
  char **ppcVar5;
  char **ppcVar6;
  char *pcVar7;
  
  ppcVar3 = (char **)realloc(info->itext_keys,info->itext_num * 8 + 8);
  ppcVar4 = (char **)realloc(info->itext_langtags,info->itext_num * 8 + 8);
  ppcVar5 = (char **)realloc(info->itext_transkeys,info->itext_num * 8 + 8);
  ppcVar6 = (char **)realloc(info->itext_strings,info->itext_num * 8 + 8);
  if (ppcVar3 != (char **)0x0) {
    info->itext_keys = ppcVar3;
  }
  if (ppcVar4 != (char **)0x0) {
    info->itext_langtags = ppcVar4;
  }
  if (ppcVar5 != (char **)0x0) {
    info->itext_transkeys = ppcVar5;
  }
  uVar2 = 0x53;
  if ((((ppcVar6 != (char **)0x0) && (info->itext_strings = ppcVar6, ppcVar3 != (char **)0x0)) &&
      (ppcVar4 != (char **)0x0)) && (ppcVar5 != (char **)0x0)) {
    info->itext_num = info->itext_num + 1;
    pcVar7 = alloc_string(key);
    info->itext_keys[info->itext_num - 1] = pcVar7;
    pcVar7 = alloc_string(langtag);
    info->itext_langtags[info->itext_num - 1] = pcVar7;
    pcVar7 = alloc_string(transkey);
    sVar1 = info->itext_num;
    info->itext_transkeys[sVar1 - 1] = pcVar7;
    pcVar7 = (char *)malloc(size + 1);
    if (pcVar7 != (char *)0x0) {
      if (size != 0) {
        memcpy(pcVar7,str,size);
      }
      pcVar7[size] = '\0';
    }
    info->itext_strings[sVar1 - 1] = pcVar7;
    uVar2 = 0;
  }
  return uVar2;
}

Assistant:

static unsigned lodepng_add_itext_sized(LodePNGInfo* info, const char* key, const char* langtag,
  const char* transkey, const char* str, size_t size) {
  char** new_keys = (char**)(lodepng_realloc(info->itext_keys, sizeof(char*) * (info->itext_num + 1)));
  char** new_langtags = (char**)(lodepng_realloc(info->itext_langtags, sizeof(char*) * (info->itext_num + 1)));
  char** new_transkeys = (char**)(lodepng_realloc(info->itext_transkeys, sizeof(char*) * (info->itext_num + 1)));
  char** new_strings = (char**)(lodepng_realloc(info->itext_strings, sizeof(char*) * (info->itext_num + 1)));

  if (new_keys) info->itext_keys = new_keys;
  if (new_langtags) info->itext_langtags = new_langtags;
  if (new_transkeys) info->itext_transkeys = new_transkeys;
  if (new_strings) info->itext_strings = new_strings;

  if (!new_keys || !new_langtags || !new_transkeys || !new_strings) return 83; /*alloc fail*/

  ++info->itext_num;

  info->itext_keys[info->itext_num - 1] = alloc_string(key);
  info->itext_langtags[info->itext_num - 1] = alloc_string(langtag);
  info->itext_transkeys[info->itext_num - 1] = alloc_string(transkey);
  info->itext_strings[info->itext_num - 1] = alloc_string_sized(str, size);

  return 0;
}